

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgReadDeviceID(ZvgID_s *devID)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  uint local_28;
  uint local_24;
  uint jj;
  uint ii;
  uint err;
  uint idLen;
  ZvgID_s *devID_local;
  
  _err = devID;
  devID_local._4_4_ = zvgGetDeviceID(ZvgIO.mBfr,0x100,&ii);
  if ((devID_local._4_4_ == 0) && (uVar1 = zvgSetEcpMode(), devID_local._4_4_ = uVar1, uVar1 == 0))
  {
    iVar2 = strncmp((char *)ZvgIO.mBfr,"MFG:",4);
    if (iVar2 == 0) {
      local_28 = 0;
      local_24 = 4;
      while( true ) {
        bVar4 = false;
        if ((local_28 < 0x10) && (bVar4 = false, ZvgIO.mBfr[local_24] != ';')) {
          bVar4 = local_24 < ii;
        }
        if (!bVar4) break;
        _err->mfg[local_28] = ZvgIO.mBfr[local_24];
        local_28 = local_28 + 1;
        local_24 = local_24 + 1;
      }
      _err->mfg[local_28] = '\0';
      iVar2 = strncmp((char *)(ZvgIO.mBfr + (local_24 + 3)),"CMD:",4);
      if ((iVar2 == 0) && (local_24 + 3 < ii)) {
        local_28 = 0;
        local_24 = local_24 + 7;
        while( true ) {
          bVar4 = false;
          if ((local_28 < 0x10) && (bVar4 = false, ZvgIO.mBfr[local_24] != ';')) {
            bVar4 = local_24 < ii;
          }
          if (!bVar4) break;
          _err->cmd[local_28] = ZvgIO.mBfr[local_24];
          local_28 = local_28 + 1;
          local_24 = local_24 + 1;
        }
        _err->cmd[local_28] = '\0';
        iVar2 = strncmp((char *)(ZvgIO.mBfr + (local_24 + 3)),"MDL:",4);
        if ((iVar2 == 0) && (local_24 + 3 < ii)) {
          local_28 = 0;
          local_24 = local_24 + 7;
          while( true ) {
            bVar4 = false;
            if ((local_28 < 0x10) && (bVar4 = false, ZvgIO.mBfr[local_24] != ';')) {
              bVar4 = local_24 < ii;
            }
            if (!bVar4) break;
            _err->mdl[local_28] = ZvgIO.mBfr[local_24];
            local_28 = local_28 + 1;
            local_24 = local_24 + 1;
          }
          _err->mdl[local_28] = '\0';
          iVar2 = strncmp((char *)(ZvgIO.mBfr + (local_24 + 3)),"VER:",4);
          if ((iVar2 == 0) && (local_24 + 3 < ii)) {
            uVar3 = strtoul((char *)(ZvgIO.mBfr + (local_24 + 7)),(char **)0x0,0x10);
            _err->fVer = (uint)uVar3;
            if ((ZvgIO.mBfr[local_24 + 0xb] == ',') && (local_24 + 0xb < ii)) {
              uVar3 = strtoul((char *)(ZvgIO.mBfr + (local_24 + 0xc)),(char **)0x0,0x10);
              _err->bVer = (uint)uVar3;
              if ((ZvgIO.mBfr[local_24 + 0x10] == ',') && (local_24 + 0x10 < ii)) {
                uVar3 = strtoul((char *)(ZvgIO.mBfr + (local_24 + 0x11)),(char **)0x0,0x10);
                _err->vVer = (uint)uVar3;
                if ((ZvgIO.mBfr[local_24 + 0x15] == ';') && (local_24 + 0x15 < ii)) {
                  iVar2 = strncmp((char *)(ZvgIO.mBfr + (local_24 + 0x18)),"SWS:",4);
                  if ((iVar2 == 0) && (local_24 + 0x18 < ii)) {
                    uVar3 = strtoul((char *)(ZvgIO.mBfr + (local_24 + 0x1c)),(char **)0x0,0x10);
                    _err->sws = (uint)uVar3;
                    if ((ZvgIO.mBfr[local_24 + 0x1e] == ';') && (local_24 + 0x1e < ii)) {
                      iVar2 = strncmp((char *)(ZvgIO.mBfr + (local_24 + 0x21)),"ESB:",4);
                      if ((iVar2 == 0) && (local_24 + 0x21 < ii)) {
                        uVar3 = strtoul((char *)(ZvgIO.mBfr + (local_24 + 0x25)),(char **)0x0,0x10);
                        _err->fESB = (uint)uVar3;
                        if ((ZvgIO.mBfr[local_24 + 0x29] == ',') && (local_24 + 0x29 < ii)) {
                          uVar3 = strtoul((char *)(ZvgIO.mBfr + (local_24 + 0x2a)),(char **)0x0,0x10
                                         );
                          _err->vESB = (uint)uVar3;
                          if ((ZvgIO.mBfr[local_24 + 0x2e] != ';') || (ii <= local_24 + 0x2e)) {
                            devID_local._4_4_ = 0x1d;
                          }
                        }
                        else {
                          devID_local._4_4_ = 0x1d;
                        }
                      }
                      else {
                        devID_local._4_4_ = 0x1d;
                      }
                    }
                    else {
                      devID_local._4_4_ = 0x1d;
                    }
                  }
                  else {
                    devID_local._4_4_ = 0x1d;
                  }
                }
                else {
                  devID_local._4_4_ = 0x1d;
                }
              }
              else {
                devID_local._4_4_ = 0x1d;
              }
            }
            else {
              devID_local._4_4_ = 0x1d;
            }
          }
          else {
            devID_local._4_4_ = 0x1d;
          }
        }
        else {
          devID_local._4_4_ = 0x1d;
        }
      }
      else {
        devID_local._4_4_ = 0x1d;
      }
    }
    else {
      devID_local._4_4_ = 0x1d;
    }
  }
  return devID_local._4_4_;
}

Assistant:

uint zvgReadDeviceID( ZvgID_s *devID)
{
	uint	idLen, err, ii, jj;

	err = zvgGetDeviceID( ZvgIO.mBfr, ZVG_MAX_BFRSZ, &idLen);

	if (err)
		return (err);

	// return to ECP mode

	err = zvgSetEcpMode();

	if (err)
		return (err);

	// parse buffer

	ii = 0;

	// Get "MFG:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MFG:", 4) != 0)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mfg[jj++] = ZvgIO.mBfr[ii++];

	devID->mfg[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "CMD:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "CMD:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->cmd[jj++] = ZvgIO.mBfr[ii++];

	devID->cmd[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "MDL:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MDL:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mdl[jj++] = ZvgIO.mBfr[ii++];

	devID->mdl[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "VER:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "VER:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	devID->fVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->bVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "SWS:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "SWS:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->sws = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 2;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "ESB:" (Error Status Bits)

	if (strncmp( (char*)ZvgIO.mBfr + ii, "ESB:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->fESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	return (err);
}